

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckNumber(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  Attribute *pAVar2;
  int iVar3;
  Bool BVar4;
  uint code;
  char *pcVar5;
  
  if ((attval == (AttVal *)0x0) || (pcVar5 = attval->value, pcVar5 == (char *)0x0)) {
    code = 0x256;
  }
  else {
    if (node != (Node *)0x0) {
      if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_FRAMESET)) &&
         (pAVar2 = attval->dict, pAVar2 != (Attribute *)0x0)) {
        if (pAVar2->id == TidyAttr_COLS) {
          return;
        }
        if ((pAVar2 != (Attribute *)0x0) && (pAVar2->id == TidyAttr_ROWS)) {
          return;
        }
      }
      if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
         ((node->tag->id == TidyTag_FONT && ((*pcVar5 == '-' || (*pcVar5 == '+')))))) {
        pcVar5 = pcVar5 + 1;
      }
    }
    if ((attval->attribute != (char *)0x0) &&
       (iVar3 = strcmp(attval->attribute,"tabindex"), iVar3 == 0)) {
      pcVar5 = pcVar5 + (*pcVar5 == '-');
    }
    cVar1 = *pcVar5;
    while( true ) {
      if (cVar1 == '\0') {
        return;
      }
      pcVar5 = pcVar5 + 1;
      BVar4 = prvTidyIsDigit((int)cVar1);
      if (BVar4 == no) break;
      cVar1 = *pcVar5;
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckNumber( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check <frameset cols=... rows=...> */
    if ( nodeIsFRAMESET(node) &&
        (attrIsCOLS(attval) || attrIsROWS(attval)))
     return;

    p  = attval->value;
    
    /* font size may be preceded by + or - */
    if ( nodeIsFONT(node) && (*p == '+' || *p == '-') )
        ++p;
    /* tabindex may be preceded by - */
    if (attval->attribute && (strcmp(attval->attribute,"tabindex") == 0) && (*p == '-'))
        ++p;

    while (*p)
    {
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}